

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall GlobOpt::ValueNumberLdElemDst(GlobOpt *this,Instr **pInstr,Value *srcVal)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  BailOutKind BVar7;
  ProfiledInstr *pPVar8;
  RegOpnd *pRVar9;
  IndirOpnd *indirOpnd;
  JITTimeFunctionBody *pJVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  undefined4 *puVar13;
  Value *this_00;
  char16 *pcVar14;
  char *in_RCX;
  Instr *pIVar15;
  char16_t *pcVar16;
  BailOutKind bailOutKind;
  ValueInfo *pVVar17;
  Opnd *this_01;
  wchar local_2b8 [4];
  char16 debugStringBuffer [42];
  wchar local_1b8 [4];
  char16 debugStringBuffer_1 [42];
  char local_158 [8];
  char baseValueTypeStr [256];
  Value *local_50;
  char16 *local_48;
  undefined8 local_40;
  BailOutKind local_38;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType profiledElementType;
  ValueType baseValueType;
  
  this_01 = (*pInstr)->m_dst;
  local_50 = (Value *)0x0;
  if (srcVal == (Value *)0x0) {
    pVVar17 = (ValueInfo *)0x0;
  }
  else {
    pVVar17 = srcVal->valueInfo;
  }
  ValueType::ValueType((ValueType *)&local_34.field_0);
  if ((*pInstr)->m_kind == InstrKindProfiled) {
    pPVar8 = IR::Instr::AsProfiledInstr(*pInstr);
    local_34 = (anon_union_2_4_ea848c7b_for_ValueType_13)
               *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(((pPVar8->u).ldElemInfo)->elemType).field_0.field_0;
    bVar2 = ValueType::IsLikelyInt((ValueType *)&local_34.field_0);
    if ((bVar2) && (bVar2 = IR::Opnd::IsRegOpnd(this_01), bVar2)) {
      pRVar9 = IR::Opnd::AsRegOpnd(this_01);
      if ((srcVal != (Value *)0x0) && ((*(uint *)&pRVar9->m_sym->field_0x18 & 2) == 0)) {
LAB_0042e6ff:
        bVar2 = ValueType::IsUninitialized(&pVVar17->super_ValueType);
        if (bVar2) {
          if (this->prePassLoop == (Loop *)0x0) {
            (pVVar17->super_ValueType).field_0.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_34;
            IR::Opnd::SetValueType((*pInstr)->m_src1,(ValueType)local_34.field_0);
          }
          else {
            local_50 = NewGenericValue(this,(ValueType)local_34.field_0,this_01);
          }
        }
      }
    }
    else if (srcVal != (Value *)0x0) goto LAB_0042e6ff;
  }
  indirOpnd = IR::Opnd::AsIndirOpnd((*pInstr)->m_src1);
  local_32[0] = (indirOpnd->m_baseOpnd->super_Opnd).m_valueType.field_0;
  bVar2 = IR::Instr::DoStackArgsOpt(*pInstr);
  if ((((bVar2) ||
       ((bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0), !bVar2
        && ((bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0), !bVar2 ||
            ((*pInstr)->m_kind != InstrKindProfiled)))))) ||
      ((bVar2 = DoTypedArrayTypeSpec(this), !bVar2 &&
       (bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0), bVar2))))
     || (((bVar2 = DoNativeArrayTypeSpec(this), !bVar2 &&
          (bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0), bVar2)) ||
         (bVar2 = ShouldExpectConventionalArrayIndexValue(this,indirOpnd), !bVar2)))) {
    bVar2 = DoTypedArrayTypeSpec(this);
    if ((bVar2) && (this->prePassLoop == (Loop *)0x0)) {
      local_40 = (char16_t *)this_01;
      uVar4 = Func::GetSourceContextId(this->func);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar4,uVar5);
      if (bVar2) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"Didn\'t specialize array access.\n");
        IR::Instr::Dump(*pInstr);
        Output::Flush();
      }
      uVar4 = Func::GetSourceContextId(this->func);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TypedArrayTypeSpecPhase,uVar4,uVar5);
      this_01 = (Opnd *)local_40;
      if (bVar2) {
        ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_158);
        pJVar10 = Func::GetJITFunctionBody(this->func);
        local_48 = JITTimeFunctionBody::GetDisplayName(pJVar10);
        pcVar11 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_2b8);
        pcVar12 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
        bVar2 = IR::Instr::DoStackArgsOpt(*pInstr);
        if (bVar2) {
          pcVar16 = L"instruction uses the arguments object";
        }
        else {
          bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0);
          pcVar16 = L"of array type";
          if (bVar2) {
            pcVar16 = L"index is negative or likely not int";
          }
        }
        Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because %s.\n"
                      ,local_48,pcVar11,pcVar12,local_158,pcVar16);
        Output::Flush();
        this_01 = (Opnd *)local_40;
      }
    }
    goto LAB_0042ebcf;
  }
  bVar2 = IR::Opnd::IsIndirOpnd((*pInstr)->m_src1);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    in_RCX = "instr->GetSrc1()->IsIndirOpnd()";
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1521,"(instr->GetSrc1()->IsIndirOpnd())","instr->GetSrc1()->IsIndirOpnd()"
                      );
    if (!bVar2) goto LAB_0042f14f;
    *puVar13 = 0;
  }
  OVar3 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0);
  uVar6 = OVar3 - 5;
  if (uVar6 < 0x1b) {
    bailOutKind = BailOutConventionalTypedArrayAccessOnly;
    switch((uint)OVar3) {
    case 5:
    case 0xe:
    case 0x17:
      local_40 = (char16_t *)CONCAT44(local_40._4_4_,0xffffff80);
      local_48 = (char16 *)CONCAT44(local_48._4_4_,0x7f);
      break;
    default:
      local_40 = (char16_t *)((ulong)local_40._4_4_ << 0x20);
      local_48 = (char16 *)CONCAT44(local_48._4_4_,0xff);
      break;
    case 8:
    case 0x11:
    case 0x1a:
      local_40 = (char16_t *)CONCAT44(local_40._4_4_,0xffff8000);
      local_48 = (char16 *)CONCAT44(local_48._4_4_,0x7fff);
      break;
    case 9:
    case 0x12:
    case 0x1b:
      local_40 = (char16_t *)((ulong)local_40._4_4_ << 0x20);
      local_48 = (char16 *)CONCAT44(local_48._4_4_,0xffff);
      break;
    case 10:
    case 0xb:
    case 0x13:
    case 0x14:
    case 0x1c:
    case 0x1d:
      local_40 = (char16_t *)CONCAT44(local_40._4_4_,0x80000000);
      local_48 = (char16 *)CONCAT44(local_48._4_4_,0x7fffffff);
      break;
    case 0xc:
    case 0xd:
    case 0x15:
    case 0x16:
    case 0x1e:
    case 0x1f:
      local_48 = (char16 *)
                 CONCAT44(local_48._4_4_,
                          (int)CONCAT71((int7)((ulong)((long)&switchD_0042e9bc::switchdataD_00e30738
                                                      + (long)(int)(&switchD_0042e9bc::
                                                                     switchdataD_00e30738)[uVar6])
                                              >> 8),1));
      baseValueTypeStr[0xfc] = '\0';
      baseValueTypeStr[0xfd] = '\0';
      baseValueTypeStr[0xfe] = '\0';
      baseValueTypeStr[0xff] = '\0';
LAB_0042ea5d:
      bVar2 = IR::Opnd::IsRegOpnd(this_01);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        local_38 = bailOutKind;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1592,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
        if (!bVar2) goto LAB_0042f14f;
        *puVar13 = 0;
        bailOutKind = local_38;
      }
      if ((this->field_0xf5 & 0x20) != 0) {
        if (this->prePassLoop == (Loop *)0x0) {
          if (((*pInstr)->field_0x38 & 0x10) == 0) {
            GenerateBailAtOperation(this,pInstr,bailOutKind);
          }
          else {
            BVar7 = IR::Instr::GetBailOutKind(*pInstr);
            local_38 = bailOutKind;
            if ((((BVar7 & ~BailOutKindBits) != BailOutOnImplicitCallsPreOp) &&
                ((BVar7 & ~BailOutKindBits) != BailOutInvalid)) ||
               ((BVar7 & (LazyBailOut|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                          BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                          BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                          BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                         BailOutOnResultConditions)) != BailOutInvalid)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar13 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x15af,
                                 "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                                 ,
                                 "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                                );
              if (!bVar2) goto LAB_0042f14f;
              *puVar13 = 0;
            }
            if ((char)local_48 == '\0') {
              if (baseValueTypeStr[0xfc] == '\0') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar13 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                   ,0x15bc,
                                   "(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)",
                                   "bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
                if (!bVar2) goto LAB_0042f14f;
                *puVar13 = 0;
              }
              pIVar15 = *pInstr;
              BVar7 = BVar7 | local_38;
            }
            else {
              pIVar15 = *pInstr;
              BVar7 = BVar7 & (BailOutMisc|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                               BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                               BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                               BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                              BailOutOnResultConditions) | BailOutConventionalTypedArrayAccessOnly;
            }
            IR::Instr::SetBailOutKind(pIVar15,BVar7);
          }
        }
        TypeSpecializeFloatDst(this,*pInstr,(Value *)0x0,(Value *)0x0,(Value *)0x0,&local_50);
        local_40 = L"float64";
        goto LAB_0042edf5;
      }
      goto LAB_0042ebcf;
    }
  }
  else {
    bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      in_RCX = "baseValueType.IsLikelyNativeArray()";
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x15ca,"(baseValueType.IsLikelyNativeArray())",
                         "baseValueType.IsLikelyNativeArray()");
      if (!bVar2) goto LAB_0042f14f;
      *puVar13 = 0;
    }
    bVar2 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
    if (!bVar2) {
      bVar2 = ValueType::HasFloatElements((ValueType *)&local_32[0].field_0);
      bailOutKind = BailOutConventionalNativeArrayAccessOnly;
      baseValueTypeStr._252_4_ = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
      if (bVar2) {
        local_48 = (char16 *)((ulong)local_48 & 0xffffffff00000000);
      }
      else {
        AssertCount = AssertCount + 1;
        local_40 = (char16_t *)this_01;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x15d0,"(baseValueType.HasFloatElements())",
                           "baseValueType.HasFloatElements()");
        if (!bVar2) goto LAB_0042f14f;
        *puVar13 = 0;
        local_48 = (char16 *)((ulong)local_48 & 0xffffffff00000000);
        this_01 = (Opnd *)local_40;
      }
      goto LAB_0042ea5d;
    }
    local_40 = (char16_t *)CONCAT44(local_40._4_4_,0x80000000);
    local_48 = (char16 *)CONCAT44(local_48._4_4_,0x7fffffff);
    bailOutKind = BailOutConventionalNativeArrayAccessOnly;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    local_38 = bailOutKind;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1553,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar2) goto LAB_0042f14f;
    *puVar13 = 0;
    bailOutKind = local_38;
  }
  if ((this->field_0xf5 & 0x22) == 0) {
LAB_0042ebcf:
    if (local_50 == (Value *)0x0) {
      if (srcVal == (Value *)0x0) {
        local_50 = NewGenericValue(this,(ValueType)local_34.field_0,this_01);
      }
      else {
        local_50 = ValueNumberTransferDst(this,*pInstr,srcVal);
      }
    }
    return local_50;
  }
  if (this->prePassLoop == (Loop *)0x0) {
    if (((*pInstr)->field_0x38 & 0x10) == 0) {
      GenerateBailAtOperation(this,pInstr,bailOutKind);
    }
    else {
      BVar7 = IR::Instr::GetBailOutKind(*pInstr);
      local_38 = bailOutKind;
      if ((((BVar7 & ~BailOutKindBits) != BailOutOnImplicitCallsPreOp) &&
          ((BVar7 & ~BailOutKindBits) != BailOutInvalid)) ||
         ((BVar7 & (LazyBailOut|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                    BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                    BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                    BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                   BailOutOnResultConditions)) != BailOutInvalid)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1571,
                           "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                           ,
                           "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                          );
        if (!bVar2) goto LAB_0042f14f;
        *puVar13 = 0;
      }
      if (local_38 == BailOutConventionalNativeArrayAccessOnly) {
LAB_0042eda8:
        pIVar15 = *pInstr;
        BVar7 = BVar7 | local_38;
      }
      else {
        if (local_38 != BailOutConventionalTypedArrayAccessOnly) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x157e,"(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)"
                             ,"bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
          if (!bVar2) {
LAB_0042f14f:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar13 = 0;
          goto LAB_0042eda8;
        }
        pIVar15 = *pInstr;
        BVar7 = BVar7 & (BailOutMisc|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                         BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                         BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                         BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                        BailOutOnResultConditions) | BailOutConventionalTypedArrayAccessOnly;
      }
      bailOutKind = local_38;
      IR::Instr::SetBailOutKind(pIVar15,BVar7);
    }
  }
  TypeSpecializeIntDst
            (this,*pInstr,(*pInstr)->m_opcode,(Value *)0x0,(Value *)0x0,(Value *)0x0,bailOutKind,
             (int32)local_40,(int32)local_48,&local_50,(AddSubConstantInfo *)0x0);
  local_40 = L"int32";
LAB_0042edf5:
  this_00 = local_50;
  if (local_50 == (Value *)0x0) {
    this_00 = NewGenericValue(this,(ValueType)local_34.field_0,this_01);
  }
  uVar4 = Func::GetSourceContextId(this->func);
  uVar5 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar4,uVar5);
  if (bVar2) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized array access.\n");
    IR::Instr::Dump(*pInstr);
    Output::Flush();
  }
  uVar4 = Func::GetSourceContextId(this->func);
  uVar5 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TypedArrayTypeSpecPhase,uVar4,uVar5);
  if (!bVar2) {
    return this_00;
  }
  ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_158);
  ValueType::ToString(&this_00->valueInfo->super_ValueType,(char (*) [256])local_2b8);
  pJVar10 = Func::GetJITFunctionBody(this->func);
  pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
  pcVar12 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_1b8);
  pcVar14 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
  Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s producing %S"
                ,pcVar11,pcVar12,pcVar14,local_158,local_40,(char (*) [256])local_2b8);
  Output::Print(L" (");
  ::Value::Dump(this_00);
  Output::Print(L").\n");
  Output::Flush();
  return this_00;
}

Assistant:

Value *
GlobOpt::ValueNumberLdElemDst(IR::Instr **pInstr, Value *srcVal)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *dst = instr->GetDst();
    Value *dstVal = nullptr;
    int32 newMin, newMax;
    ValueInfo *srcValueInfo = (srcVal ? srcVal->GetValueInfo() : nullptr);

    ValueType profiledElementType;
    if (instr->IsProfiledInstr())
    {
        profiledElementType = instr->AsProfiledInstr()->u.ldElemInfo->GetElementType();
        if(!(profiledElementType.IsLikelyInt() && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber) &&
            srcVal &&
            srcValueInfo->IsUninitialized())
        {
            if(IsLoopPrePass())
            {
                dstVal = NewGenericValue(profiledElementType, dst);
            }
            else
            {
                // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                // can improve the original value type.
                srcValueInfo->Type() = profiledElementType;
                instr->GetSrc1()->SetValueType(profiledElementType);
            }
        }
    }
    
    IR::IndirOpnd *src = instr->GetSrc1()->AsIndirOpnd();
    const ValueType baseValueType(src->GetBaseOpnd()->GetValueType());
    if (instr->DoStackArgsOpt() ||
        !(
            baseValueType.IsLikelyOptimizedTypedArray() ||
            (baseValueType.IsLikelyNativeArray() && instr->IsProfiledInstr()) // Specialized native array lowering for LdElem requires that it is profiled.
        ) ||
        (!this->DoTypedArrayTypeSpec() && baseValueType.IsLikelyOptimizedTypedArray()) ||

        // Don't do type spec on native array with a history of accessing gaps, as this is a bailout
        (!this->DoNativeArrayTypeSpec() && baseValueType.IsLikelyNativeArray()) ||
        !ShouldExpectConventionalArrayIndexValue(src))
    {
        if(DoTypedArrayTypeSpec() && !IsLoopPrePass())
        {
            GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access.\n"));
            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because %s.\n"),
                    this->func->GetJITFunctionBody()->GetDisplayName(),
                    this->func->GetDebugNumberSet(debugStringBuffer),
                    Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                    baseValueTypeStr,
                    instr->DoStackArgsOpt() ? _u("instruction uses the arguments object") :
                    baseValueType.IsLikelyOptimizedTypedArray() ? _u("index is negative or likely not int") : _u("of array type"));
                Output::Flush();
            }
        }

        if(!dstVal)
        {
            if(srcVal)
            {
                dstVal = this->ValueNumberTransferDst(instr, srcVal);
            }
            else
            {
                dstVal = NewGenericValue(profiledElementType, dst);
            }
        }
        return dstVal;
    }

    Assert(instr->GetSrc1()->IsIndirOpnd());

    IRType toType = TyVar;
    IR::BailOutKind bailOutKind = IR::BailOutConventionalTypedArrayAccessOnly;

    switch(baseValueType.GetObjectType())
    {
    case ObjectType::Int8Array:
    case ObjectType::Int8VirtualArray:
    case ObjectType::Int8MixedArray:
        newMin = Int8ConstMin;
        newMax = Int8ConstMax;
        goto IntArrayCommon;

    case ObjectType::Uint8Array:
    case ObjectType::Uint8VirtualArray:
    case ObjectType::Uint8MixedArray:
    case ObjectType::Uint8ClampedArray:
    case ObjectType::Uint8ClampedVirtualArray:
    case ObjectType::Uint8ClampedMixedArray:
        newMin = Uint8ConstMin;
        newMax = Uint8ConstMax;
        goto IntArrayCommon;

    case ObjectType::Int16Array:
    case ObjectType::Int16VirtualArray:
    case ObjectType::Int16MixedArray:
        newMin = Int16ConstMin;
        newMax = Int16ConstMax;
        goto IntArrayCommon;

    case ObjectType::Uint16Array:
    case ObjectType::Uint16VirtualArray:
    case ObjectType::Uint16MixedArray:
        newMin = Uint16ConstMin;
        newMax = Uint16ConstMax;
        goto IntArrayCommon;

    case ObjectType::Int32Array:
    case ObjectType::Int32VirtualArray:
    case ObjectType::Int32MixedArray:
    case ObjectType::Uint32Array: // int-specialized loads from uint32 arrays will bail out on values that don't fit in an int32
    case ObjectType::Uint32VirtualArray:
    case ObjectType::Uint32MixedArray:
    Int32Array:
        newMin = Int32ConstMin;
        newMax = Int32ConstMax;
        goto IntArrayCommon;

    IntArrayCommon:
        Assert(dst->IsRegOpnd());

        // If int type spec is disabled, it is ok to load int values as they can help float type spec, and merging int32 with float64 => float64.
        // But if float type spec is also disabled, we'll have problems because float64 merged with var => float64...
        if (!this->DoAggressiveIntTypeSpec() && !this->DoFloatTypeSpec())
        {
            if (!dstVal)
            {
                if (srcVal)
                {
                    dstVal = this->ValueNumberTransferDst(instr, srcVal);
                }
                else
                {
                    dstVal = NewGenericValue(profiledElementType, dst);
                }
            }
            return dstVal;
        }

        if (!this->IsLoopPrePass())
        {
            if (instr->HasBailOutInfo())
            {
                const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                Assert(
                    (
                        !(oldBailOutKind & ~IR::BailOutKindBits) ||
                        (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                    !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                if (bailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                    // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                    // bails out for the right reason.
                    instr->SetBailOutKind(
                        bailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                }
                else
                {
                    // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                    // calls to occur, so it must be merged in to eliminate generating the helper call
                    Assert(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                    instr->SetBailOutKind(oldBailOutKind | bailOutKind);
                }
            }
            else
            {
                GenerateBailAtOperation(&instr, bailOutKind);
            }
        }
        TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, nullptr, nullptr, bailOutKind, newMin, newMax, &dstVal);
        toType = TyInt32;
        break;

    case ObjectType::Float32Array:
    case ObjectType::Float32VirtualArray:
    case ObjectType::Float32MixedArray:
    case ObjectType::Float64Array:
    case ObjectType::Float64VirtualArray:
    case ObjectType::Float64MixedArray:
    Float64Array:
        Assert(dst->IsRegOpnd());

        // If float type spec is disabled, don't load float64 values
        if (!this->DoFloatTypeSpec())
        {
            if (!dstVal)
            {
                if (srcVal)
                {
                    dstVal = this->ValueNumberTransferDst(instr, srcVal);
                }
                else
                {
                    dstVal = NewGenericValue(profiledElementType, dst);
                }
            }
            return dstVal;
        }

        if (!this->IsLoopPrePass())
        {
            if (instr->HasBailOutInfo())
            {
                const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                Assert(
                    (
                        !(oldBailOutKind & ~IR::BailOutKindBits) ||
                        (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                    !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                if (bailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                    // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                    // bails out for the right reason.
                    instr->SetBailOutKind(
                        bailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                }
                else
                {
                    // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                    // calls to occur, so it must be merged in to eliminate generating the helper call
                    Assert(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                    instr->SetBailOutKind(oldBailOutKind | bailOutKind);
                }
            }
            else
            {
                GenerateBailAtOperation(&instr, bailOutKind);
            }
        }
        TypeSpecializeFloatDst(instr, nullptr, nullptr, nullptr, &dstVal);
        toType = TyFloat64;
        break;

    default:
        Assert(baseValueType.IsLikelyNativeArray());
        bailOutKind = IR::BailOutConventionalNativeArrayAccessOnly;
        if(baseValueType.HasIntElements())
        {
            goto Int32Array;
        }
        Assert(baseValueType.HasFloatElements());
        goto Float64Array;
    }

    if(!dstVal)
    {
        dstVal = NewGenericValue(profiledElementType, dst);
    }

    Assert(toType != TyVar);

    GOPT_TRACE_INSTR(instr, _u("Type specialized array access.\n"));
    if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
        baseValueType.ToString(baseValueTypeStr);
        char dstValTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
        dstVal->GetValueInfo()->Type().ToString(dstValTypeStr);
        Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s producing %S"),
            this->func->GetJITFunctionBody()->GetDisplayName(),
            this->func->GetDebugNumberSet(debugStringBuffer),
            Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
            baseValueTypeStr,
            toType == TyInt32 ? _u("int32") : _u("float64"),
            dstValTypeStr);
#if DBG_DUMP
        Output::Print(_u(" ("));
        dstVal->Dump();
        Output::Print(_u(").\n"));
#else
        Output::Print(_u(".\n"));
#endif
        Output::Flush();
    }

    return dstVal;
}